

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::addClause_(SimpSolver *this,vec<Minisat::Lit> *ps)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Lit LVar6;
  Clause *this_00;
  int *piVar7;
  char *pcVar8;
  vec<Minisat::Lit> *in_RDI;
  vec<Minisat::Lit> *in_stack_00000010;
  Solver *in_stack_00000018;
  int i;
  Clause *c;
  CRef cr;
  int nclauses;
  undefined4 in_stack_ffffffffffffff78;
  Ref in_stack_ffffffffffffff7c;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffff80;
  FILE *in_stack_ffffffffffffff88;
  vec<Minisat::Lit> *in_stack_ffffffffffffff90;
  Heap<Minisat::SimpSolver::ElimLt> *this_01;
  undefined8 in_stack_ffffffffffffff98;
  uchar op;
  vec<char> *this_02;
  Solver *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  bool local_1;
  
  op = (uchar)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  iVar4 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x23));
  if (((in_RDI[0x141].cap & 0x100) == 0) ||
     (bVar3 = implied((SimpSolver *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_RDI), !bVar3)) {
    if (((in_RDI[0x13f].sz & 0x100) == 0) &&
       (lVar1._0_4_ = in_RDI[2].sz, lVar1._4_4_ = in_RDI[2].cap, lVar1 != 0)) {
      Solver::binDRUP<Minisat::vec<Minisat::Lit>>
                (in_stack_ffffffffffffffa0,op,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    bVar3 = Solver::addClause_(in_stack_00000018,in_stack_00000010);
    if (bVar3) {
      if (((((ulong)in_RDI[0x143].data & 1) != 0) &&
          (iVar5 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x23)), iVar5 == iVar4 + 1
          )) && (lVar2._0_4_ = in_RDI[0xc].sz, lVar2._4_4_ = in_RDI[0xc].cap, lVar2 == 0)) {
        vec<unsigned_int>::last((vec<unsigned_int> *)(in_RDI + 0x23));
        this_00 = ClauseAllocator::operator[]
                            ((ClauseAllocator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
        ;
        in_RDI[0x20].data = (Lit *)((long)&(in_RDI[0x20].data)->x + 1);
        Queue<unsigned_int>::insert
                  ((Queue<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
        for (local_2c = 0; iVar4 = Clause::size(this_00), local_2c < iVar4; local_2c = local_2c + 1)
        {
          iVar5 = (int)((ulong)&in_RDI[0x145].sz >> 0x20);
          LVar6 = Clause::operator[](this_00,local_2c);
          var(LVar6);
          OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::operator[]
                    (in_stack_ffffffffffffff80,
                     (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          vec<unsigned_int>::push
                    ((vec<unsigned_int> *)in_stack_ffffffffffffff80,
                     (uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          this_01 = (Heap<Minisat::SimpSolver::ElimLt> *)(in_RDI + 0x149);
          LVar6 = Clause::operator[](this_00,local_2c);
          iVar4 = toInt(LVar6);
          piVar7 = vec<int>::operator[]((vec<int> *)this_01,iVar4);
          *piVar7 = *piVar7 + 1;
          this_02 = (vec<char> *)&in_RDI[0x144].sz;
          LVar6 = Clause::operator[](this_00,local_2c);
          iVar4 = var(LVar6);
          pcVar8 = vec<char>::operator[](this_02,iVar4);
          *pcVar8 = '\x01';
          *(int *)((long)&in_RDI[0x150].data + 4) = *(int *)((long)&in_RDI[0x150].data + 4) + 1;
          LVar6 = Clause::operator[](this_00,local_2c);
          var(LVar6);
          bVar3 = Heap<Minisat::SimpSolver::ElimLt>::inHeap(this_01,iVar5);
          if (bVar3) {
            in_stack_ffffffffffffff80 =
                 (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *)
                 (in_RDI + 0x14a);
            LVar6 = Clause::operator[](this_00,local_2c);
            var(LVar6);
            Heap<Minisat::SimpSolver::ElimLt>::increase
                      ((Heap<Minisat::SimpSolver::ElimLt> *)in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff7c);
          }
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit> &ps)
{
#ifndef NDEBUG
    bool is_sat = false;
    bool has_eliminated = false;
    for (int i = 0; i < ps.size(); i++) {
        if (value(ps[i]) == l_True) is_sat = true;
        if (isEliminated(var(ps[i]))) has_eliminated = true;
    }
    assert((is_sat || !has_eliminated) && "removing clauses is done lazily");
#endif

    int nclauses = clauses.size();

    if (use_rcheck && implied(ps)) return true;

    if (!parsing && drup_file) {
#ifdef BIN_DRUP
        binDRUP('a', ps, drup_file);
#else
        for (int i = 0; i < ps.size(); i++) fprintf(drup_file, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
        fprintf(drup_file, "0\n");
#endif
    }

    if (!Solver::addClause_(ps)) return false;

    // Only simplify before actually solving
    if (use_simplification && clauses.size() == nclauses + 1 && solves == 0) {
        CRef cr = clauses.last();
        const Clause &c = ca[cr];
        statistics.simpSteps++;

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++) {
            occurs[var(c[i])].push(cr);
            n_occ[toInt(c[i])]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i]))) elim_heap.increase(var(c[i]));
        }
    }

    return true;
}